

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freopen.c
# Opt level: O0

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  FILE *__stream;
  FILE *fout;
  FILE *fin;
  
  pFVar2 = fopen("test_support/testfile1","wb+");
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xdf,"( fin = fopen( testfile1, \"wb+\" ) ) != NULL");
  }
  iVar1 = fputc(0x78,pFVar2);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xe0,"fputc( \'x\', fin ) == \'x\'");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xe1,"fclose( fin ) == 0");
  }
  pFVar2 = freopen("test_support/testfile1","rb",(FILE *)stdin);
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xe2,"( fin = freopen( testfile1, \"rb\", stdin ) ) != NULL");
  }
  iVar1 = getchar();
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xe3,"getchar() == \'x\'");
  }
  __stream = freopen("test_support/testfile2","wb+",(FILE *)stdout);
  if (__stream == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xe5,"( fout = freopen( testfile2, \"wb+\", stdout ) ) != NULL");
  }
  iVar1 = putchar(0x78);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xe6,"putchar( \'x\' ) == \'x\'");
  }
  rewind(__stream);
  iVar1 = fgetc(__stream);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xe8,"fgetc( fout ) == \'x\'");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xea,"fclose( fin ) == 0");
  }
  iVar1 = fclose(__stream);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xeb,"fclose( fout ) == 0");
  }
  iVar1 = remove("test_support/testfile1");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xec,"remove( testfile1 ) == 0");
  }
  iVar1 = remove("test_support/testfile2");
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/freopen.c, line %d - %s\n"
           ,0xed,"remove( testfile2 ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * fin;
    FILE * fout;
    TESTCASE( ( fin = fopen( testfile1, "wb+" ) ) != NULL );
    TESTCASE( fputc( 'x', fin ) == 'x' );
    TESTCASE( fclose( fin ) == 0 );
    TESTCASE( ( fin = freopen( testfile1, "rb", stdin ) ) != NULL );
    TESTCASE( getchar() == 'x' );

    TESTCASE( ( fout = freopen( testfile2, "wb+", stdout ) ) != NULL );
    TESTCASE( putchar( 'x' ) == 'x' );
    rewind( fout );
    TESTCASE( fgetc( fout ) == 'x' );

    TESTCASE( fclose( fin ) == 0 );
    TESTCASE( fclose( fout ) == 0 );
    TESTCASE( remove( testfile1 ) == 0 );
    TESTCASE( remove( testfile2 ) == 0 );

    return TEST_RESULTS;
}